

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  long in_RDI;
  int i;
  int in_stack_ffffffffffffffdc;
  ImGuiWindowTempData *in_stack_ffffffffffffffe0;
  int local_c;
  
  if (*(long *)(in_RDI + 0x2b0) == in_RDI + 0x2b8) {
    IM_DELETE<char>((char *)0x1774a4);
    for (local_c = 0; local_c != *(int *)(in_RDI + 0x298); local_c = local_c + 1) {
      in_stack_ffffffffffffffe0 =
           (ImGuiWindowTempData *)
           ImVector<ImGuiColumns>::operator[]
                     ((ImVector<ImGuiColumns> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc)
      ;
      ImGuiColumns::~ImGuiColumns((ImGuiColumns *)in_stack_ffffffffffffffe0);
    }
    ImDrawList::~ImDrawList((ImDrawList *)in_stack_ffffffffffffffe0);
    ImVector<ImGuiColumns>::~ImVector((ImVector<ImGuiColumns> *)in_stack_ffffffffffffffe0);
    ImGuiStorage::~ImGuiStorage((ImGuiStorage *)0x177525);
    ImGuiWindowTempData::~ImGuiWindowTempData(in_stack_ffffffffffffffe0);
    ImVector<unsigned_int>::~ImVector((ImVector<unsigned_int> *)in_stack_ffffffffffffffe0);
    return;
  }
  __assert_fail("DrawList == &DrawListInst",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                ,0xb4c,"ImGuiWindow::~ImGuiWindow()");
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiColumns();
}